

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib543.c
# Opt level: O0

int test(char *URL)

{
  long lVar1;
  long lVar2;
  char *s;
  int asize;
  CURL *easy;
  uchar a [20];
  char *URL_local;
  
  easy = (CURL *)0x1a104493d4b269c;
  a[0] = 0xe0;
  a[1] = 0xd8;
  a[2] = '|';
  a[3] = ' ';
  a[4] = 0xb7;
  a[5] = 0xef;
  a[6] = 'S';
  a[7] = ')';
  a[8] = 0xfa;
  a[9] = '\x1d';
  a[10] = 'W';
  a[0xb] = 0xe1;
  lVar1 = curl_easy_init();
  if (lVar1 == 0) {
    curl_mfprintf(_stderr,"curl_easy_init() failed\n");
    URL_local._4_4_ = 0x7e;
  }
  else {
    lVar2 = curl_easy_escape(lVar1,&easy,0x14);
    if (lVar2 != 0) {
      curl_mprintf("%s\n",lVar2);
      curl_free(lVar2);
    }
    curl_easy_cleanup(lVar1);
    URL_local._4_4_ = 0;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  unsigned char a[] = {0x9c, 0x26, 0x4b, 0x3d, 0x49, 0x4, 0xa1, 0x1,
                       0xe0, 0xd8, 0x7c,  0x20, 0xb7, 0xef, 0x53, 0x29, 0xfa,
                       0x1d, 0x57, 0xe1};

  CURL *easy;
  int asize;
  char *s;
  (void)URL;

  easy = curl_easy_init();
  if(!easy) {
    fprintf(stderr, "curl_easy_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  asize = (int)sizeof(a);

  s = curl_easy_escape(easy, (char *)a, asize);

  if(s)
    printf("%s\n", s);

  if(s)
    curl_free(s);

  curl_easy_cleanup(easy);

  return 0;
}